

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tracer.h
# Opt level: O0

expected<std::unique_ptr<opentracing::v3::SpanContext,_std::default_delete<opentracing::v3::SpanContext>_>,_std::error_code>
* __thiscall
jaegertracing::Tracer::Extract
          (expected<std::unique_ptr<opentracing::v3::SpanContext,_std::default_delete<opentracing::v3::SpanContext>_>,_std::error_code>
           *__return_storage_ptr__,Tracer *this,HTTPHeadersReader *reader)

{
  bool bVar1;
  element_type *peVar2;
  SpanContext *this_00;
  value_type local_1e8;
  undefined4 local_1dc;
  value_type local_1d8 [3];
  SpanContext local_1c0;
  undefined1 local_f0 [8];
  SpanContext spanContext;
  HTTPHeadersReader *reader_local;
  Tracer *this_local;
  
  spanContext._mutex.super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)reader;
  peVar2 = std::
           __shared_ptr_access<jaegertracing::propagation::Propagator<const_opentracing::v3::HTTPHeadersReader_&,_const_opentracing::v3::HTTPHeadersWriter_&>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<jaegertracing::propagation::Propagator<const_opentracing::v3::HTTPHeadersReader_&,_const_opentracing::v3::HTTPHeadersWriter_&>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->_httpHeaderPropagator);
  (*(peVar2->super_Extractor<const_opentracing::v3::HTTPHeadersReader_&>)._vptr_Extractor[2])
            (local_f0,peVar2,spanContext._mutex.super___mutex_base._M_mutex.__data.__list.__next);
  SpanContext::SpanContext(&local_1c0);
  bVar1 = jaegertracing::operator==((SpanContext *)local_f0,&local_1c0);
  SpanContext::~SpanContext(&local_1c0);
  if (bVar1) {
    std::unique_ptr<opentracing::v3::SpanContext,std::default_delete<opentracing::v3::SpanContext>>
    ::unique_ptr<std::default_delete<opentracing::v3::SpanContext>,void>
              ((unique_ptr<opentracing::v3::SpanContext,std::default_delete<opentracing::v3::SpanContext>>
                *)local_1d8);
    opentracing::v3::
    expected<std::unique_ptr<opentracing::v3::SpanContext,_std::default_delete<opentracing::v3::SpanContext>_>,_std::error_code>
    ::expected<true,_0>(__return_storage_ptr__,local_1d8);
    std::
    unique_ptr<opentracing::v3::SpanContext,_std::default_delete<opentracing::v3::SpanContext>_>::
    ~unique_ptr(local_1d8);
  }
  else {
    this_00 = (SpanContext *)operator_new(0xd0);
    SpanContext::SpanContext(this_00,(SpanContext *)local_f0);
    std::unique_ptr<opentracing::v3::SpanContext,std::default_delete<opentracing::v3::SpanContext>>
    ::unique_ptr<std::default_delete<opentracing::v3::SpanContext>,void>
              ((unique_ptr<opentracing::v3::SpanContext,std::default_delete<opentracing::v3::SpanContext>>
                *)&local_1e8,(pointer)this_00);
    opentracing::v3::
    expected<std::unique_ptr<opentracing::v3::SpanContext,_std::default_delete<opentracing::v3::SpanContext>_>,_std::error_code>
    ::expected<true,_0>(__return_storage_ptr__,&local_1e8);
    std::
    unique_ptr<opentracing::v3::SpanContext,_std::default_delete<opentracing::v3::SpanContext>_>::
    ~unique_ptr(&local_1e8);
  }
  local_1dc = 1;
  SpanContext::~SpanContext((SpanContext *)local_f0);
  return __return_storage_ptr__;
}

Assistant:

opentracing::expected<std::unique_ptr<opentracing::SpanContext>>
    Extract(const opentracing::HTTPHeadersReader& reader) const override
    {
        const auto spanContext = _httpHeaderPropagator->extract(reader);
        if (spanContext == SpanContext()) {
            return std::unique_ptr<opentracing::SpanContext>();
        }
        return std::unique_ptr<opentracing::SpanContext>(
            new SpanContext(spanContext));
    }